

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# get-model.cpp
# Opt level: O2

char * get_model_or_exit(int argc,char **argv)

{
  char *pcVar1;
  
  if (argc < 2) {
    pcVar1 = getenv("LLAMACPP_TEST_MODELFILE");
    if ((pcVar1 == (char *)0x0) || (*pcVar1 == '\0')) {
      fwrite("\x1b[33mWARNING: No model file provided. Skipping this test. Set LLAMACPP_TEST_MODELFILE=<gguf_model_path> to silence this warning and run this test.\n\x1b[0m"
             ,0x97,1,_stderr);
      exit(0);
    }
  }
  else {
    pcVar1 = argv[1];
  }
  return pcVar1;
}

Assistant:

char * get_model_or_exit(int argc, char *argv[]) {
    char * model_path;
    if (argc > 1) {
        model_path = argv[1];

    } else {
        model_path = getenv("LLAMACPP_TEST_MODELFILE");
        if (!model_path || strlen(model_path) == 0) {
            fprintf(stderr, "\033[33mWARNING: No model file provided. Skipping this test. Set LLAMACPP_TEST_MODELFILE=<gguf_model_path> to silence this warning and run this test.\n\033[0m");
            exit(EXIT_SUCCESS);
        }
    }

    return model_path;
}